

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
               (int num1,_func_int_char_ptr_ptr_char_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  char (*pacVar8) [16];
  byte *pbVar9;
  byte bVar10;
  FILE *pFVar11;
  char (*pacVar12) [16];
  undefined1 *puVar13;
  code *pcVar14;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  float fVar15;
  uint extraout_EDX_01;
  char *pcVar16;
  byte *pbVar17;
  double dVar18;
  uint uVar19;
  byte *pbVar20;
  byte *pbVar21;
  char *pcVar22;
  undefined8 *puVar23;
  undefined1 *puVar24;
  char *pcVar25;
  undefined4 uVar26;
  uint uVar27;
  uint *puVar28;
  ulong uVar29;
  char (*pacVar30) [16];
  char cVar31;
  char *pcVar32;
  undefined8 uVar33;
  short sVar34;
  ulong uVar35;
  undefined8 *puVar36;
  char *pcVar37;
  byte *pbVar38;
  ulong uVar39;
  char *pcVar40;
  undefined *puVar41;
  char *pcVar42;
  byte *pbVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_1a08;
  undefined1 *puStack_1a00;
  char acStack_19f8 [256];
  undefined1 uStack_18f8;
  undefined8 uStack_18f7;
  undefined1 auStack_18ef [255];
  char (*pacStack_17f0) [16];
  undefined8 uStack_17e8;
  undefined *puStack_17e0;
  code *pcStack_17d8;
  double dStack_17d0;
  byte *pbStack_17c8;
  char acStack_17c0 [256];
  byte abStack_16c0 [16];
  byte abStack_16b0 [248];
  long lStack_15b8;
  ulong uStack_15b0;
  char *pcStack_15a8;
  char *pcStack_15a0;
  char *pcStack_1598;
  code *pcStack_1590;
  char (*pacStack_1588) [16];
  char *pcStack_1580;
  float fStack_1578;
  undefined4 uStack_1574;
  double dStack_1570;
  double dStack_1568;
  char (*pacStack_1560) [16];
  char acStack_1558 [256];
  byte bStack_1458;
  undefined8 uStack_1457;
  char acStack_144f [255];
  long lStack_1350;
  ulong uStack_1348;
  char *pcStack_1340;
  char *pcStack_1338;
  char *pcStack_1330;
  code *pcStack_1328;
  char (*pacStack_1320) [16];
  char *pcStack_1318;
  float fStack_1310;
  undefined4 uStack_130c;
  double dStack_1308;
  double dStack_1300;
  code *pcStack_12f8;
  byte bStack_12f0;
  undefined8 uStack_12ef;
  char acStack_12e7 [247];
  char acStack_11f0 [256];
  undefined1 auStack_10f0 [8];
  undefined8 *puStack_10e8;
  ulong uStack_10e0;
  undefined8 *puStack_10d8;
  long lStack_10d0;
  undefined1 *puStack_10c8;
  code *pcStack_10c0;
  code *pcStack_10b8;
  float fStack_10ac;
  double dStack_10a8;
  double dStack_10a0;
  undefined8 *puStack_1098;
  char (*pacStack_1090) [16];
  byte bStack_1088;
  undefined1 auStack_1087 [2];
  undefined1 auStack_1085 [6];
  undefined8 auStack_107f [30];
  char acStack_f88 [256];
  undefined1 auStack_e88 [8];
  char (*pacStack_e80) [16];
  char *pcStack_e78;
  char *pcStack_e70;
  char (*pacStack_e68) [16];
  long lStack_e60;
  code *pcStack_e58;
  float fStack_e44;
  char (*pacStack_e40) [16];
  int iStack_e34;
  double dStack_e30;
  double dStack_e28;
  byte bStack_e20;
  undefined8 uStack_e1f;
  char acStack_e17 [247];
  char acStack_d20 [256];
  undefined1 auStack_c20 [8];
  ulong uStack_c18;
  char *pcStack_c10;
  long lStack_c08;
  undefined1 *puStack_c00;
  undefined1 *puStack_bf8;
  code *pcStack_bf0;
  uint uStack_bdc;
  ulong uStack_bd8;
  float fStack_bcc;
  ulong uStack_bc8;
  double dStack_bc0;
  byte bStack_bb8;
  undefined8 uStack_bb7;
  undefined1 auStack_baf [247];
  char acStack_ab8 [256];
  char acStack_9b8 [8];
  byte *pbStack_9b0;
  byte *pbStack_9a8;
  byte *pbStack_9a0;
  char (*pacStack_998) [16];
  ulong uStack_990;
  code *pcStack_988;
  char (*pacStack_980) [16];
  float fStack_978;
  int iStack_974;
  ulong uStack_970;
  double dStack_968;
  byte bStack_960;
  undefined8 uStack_95f;
  byte abStack_957 [247];
  char acStack_860 [256];
  undefined1 auStack_760 [8];
  ulong uStack_758;
  char *pcStack_750;
  undefined1 *puStack_748;
  long lStack_740;
  undefined1 *puStack_738;
  code *pcStack_730;
  uint uStack_728;
  float fStack_724;
  ulong uStack_720;
  ulong uStack_718;
  double dStack_710;
  byte bStack_708;
  undefined8 uStack_707;
  undefined1 auStack_6ff [247];
  char acStack_608 [256];
  undefined1 auStack_508 [8];
  byte *pbStack_500;
  byte *pbStack_4f8;
  ulong uStack_4f0;
  byte *pbStack_4e8;
  byte *pbStack_4e0;
  code *pcStack_4d8;
  uint uStack_4c4;
  float fStack_4c0;
  undefined4 uStack_4bc;
  ulong uStack_4b8;
  ulong uStack_4b0;
  double dStack_4a8;
  byte bStack_4a0;
  undefined8 uStack_49f;
  byte abStack_497 [247];
  char acStack_3a0 [256];
  byte abStack_2a0 [8];
  byte *pbStack_298;
  char *pcStack_290;
  ulong uStack_288;
  byte *pbStack_280;
  byte *pbStack_278;
  code *pcStack_270;
  uint local_25c;
  float local_258;
  undefined4 local_254;
  byte *local_250;
  ulong local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  byte local_22f [247];
  char local_138 [256];
  char local_38 [8];
  
  local_254 = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcVar37 = (char *)(long)num1;
  pbVar9 = (byte *)(ulong)(uint)num1;
  if (num1 < 0) {
    pcVar16 = "%lld";
    pbVar38 = (byte *)pcVar37;
  }
  else {
    pcVar16 = "%llu";
    pbVar38 = pbVar9;
  }
  pcStack_270 = (code *)0x136763;
  local_25c = num1;
  iVar2 = snprintf(local_138 + 0xe,0xf2,pcVar16,pbVar38);
  pcVar42 = local_138 + 0xe + iVar2;
  iVar3 = 0;
  pcStack_270 = (code *)0x136782;
  iVar2 = snprintf(pcVar42,(size_t)(local_38 + -(long)pcVar42)," into ");
  pcVar16 = local_38 + -(long)(pcVar42 + iVar2);
  pcStack_270 = (code *)0x1367a1;
  snprintf(pcVar42 + iVar2,(size_t)pcVar16,"int%zu_t",8);
  pcStack_270 = (code *)0x1367b0;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x1367c9;
  pFVar11 = _stdout;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x1367d9;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x1367e6;
  fputc(10,_stdout);
  if (-1 < (int)local_25c) {
    pcStack_270 = (code *)0x1367fa;
    iVar3 = test_encode_uint_all_sizes((char (*) [16])&local_238,(uint64_t)pbVar9);
  }
  pacVar12 = (char (*) [16])(&local_238 + (long)iVar3 * 0x10);
  pcStack_270 = (code *)0x13681c;
  local_250 = (byte *)pcVar37;
  iVar2 = test_encode_int_all_sizes(pacVar12,(int64_t)pcVar37);
  uVar19 = iVar3 + iVar2;
  if (uVar19 != 0 && SCARRY4(iVar3,iVar2) == (int)uVar19 < 0) {
    local_258 = (float)(int)local_25c;
    local_240 = (double)(int)local_25c;
    pbVar43 = (byte *)(ulong)uVar19;
    pbVar38 = (byte *)((long)&local_237 + 1);
    uVar35 = 0;
    do {
      uVar19 = (uint)pacVar12;
      lVar5 = uVar35 * 0x10;
      pbVar20 = &local_238 + lVar5;
      pbVar21 = pbVar38 + -2;
      bVar10 = pbVar38[-2];
      pbVar17 = (byte *)(ulong)bVar10;
      mVar1 = mp_type_hint[(long)pbVar17];
      if (mVar1 != MP_UINT) {
        if (mVar1 == MP_FLOAT) {
          if (bVar10 != 0xca) {
LAB_00136c20:
            pcStack_270 = (code *)0x136c3f;
            __assert_fail("c == 0xca",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x97e,"float mp_decode_float(const char **)");
          }
          uVar27 = *(uint *)(pbVar38 + -1);
          fVar15 = (float)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                          uVar27 << 0x18);
          if ((fVar15 == local_258) && (!NAN(fVar15) && !NAN(local_258))) {
            pcVar37 = (char *)(pbVar38 + 3);
            goto LAB_0013693f;
          }
          pcStack_270 = (code *)0x136c44;
          test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
LAB_00136c44:
          pcStack_270 = (code *)0x136c49;
          test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
          goto LAB_00136c49;
        }
        if (mVar1 == MP_INT) {
          switch(bVar10) {
          case 0xd0:
            pbVar17 = (byte *)(long)(char)pbVar38[-1];
            pcVar37 = (char *)pbVar38;
            break;
          case 0xd1:
            pbVar17 = (byte *)(long)(short)(*(ushort *)(pbVar38 + -1) << 8 |
                                           *(ushort *)(pbVar38 + -1) >> 8);
            pcVar37 = (char *)(local_22f + lVar5 + -6);
            break;
          case 0xd2:
            uVar27 = *(uint *)(pbVar38 + -1);
            pbVar17 = (byte *)(long)(int)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 |
                                          (uVar27 & 0xff00) << 8 | uVar27 << 0x18);
            pcVar37 = (char *)(local_22f + lVar5 + -4);
            break;
          case 0xd3:
            uVar39 = *(ulong *)(pbVar38 + -1);
            pbVar17 = (byte *)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                               (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                               (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                               (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
            pcVar37 = (char *)(local_22f + lVar5);
            break;
          default:
            if (bVar10 < 0xe0) {
              pcStack_270 = (code *)0x136bf2;
              test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
              goto LAB_00136bf2;
            }
            pbVar17 = (byte *)(long)(char)bVar10;
            pcVar37 = (char *)(local_22f + lVar5 + -8);
          }
          if (pbVar17 != local_250) goto LAB_00136c44;
          goto LAB_001369da;
        }
        if (bVar10 != 0xcb) goto LAB_00136bfc;
        uVar39 = *(ulong *)(pbVar38 + -1);
        dVar18 = (double)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                          (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                          (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                          (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
        if ((dVar18 != local_240) || (NAN(dVar18) || NAN(local_240))) {
          pcStack_270 = (code *)0x136c20;
          test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
          goto LAB_00136c20;
        }
        pcVar37 = (char *)(local_22f + lVar5);
        goto LAB_0013693f;
      }
      switch(bVar10) {
      case 0xcc:
        pbVar17 = (byte *)(ulong)pbVar38[-1];
        pcVar37 = (char *)pbVar38;
        break;
      case 0xcd:
        pbVar17 = (byte *)(ulong)(ushort)(*(ushort *)(pbVar38 + -1) << 8 |
                                         *(ushort *)(pbVar38 + -1) >> 8);
        pcVar37 = (char *)(local_22f + lVar5 + -6);
        break;
      case 0xce:
        uVar27 = *(uint *)(pbVar38 + -1);
        pbVar17 = (byte *)(ulong)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8
                                 | uVar27 << 0x18);
        pcVar37 = (char *)(local_22f + lVar5 + -4);
        break;
      case 0xcf:
        uVar39 = *(ulong *)(pbVar38 + -1);
        pbVar17 = (byte *)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                           (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                           (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                           (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
        pcVar37 = (char *)(local_22f + lVar5);
        break;
      default:
        if (-1 < (char)bVar10) {
          pcVar37 = (char *)(local_22f + lVar5 + -8);
          break;
        }
LAB_00136bf2:
        pcStack_270 = (code *)0x136bf7;
        test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
        goto LAB_00136bf7;
      }
      if (pbVar17 != local_250) {
LAB_00136c49:
        uVar26 = SUB84(pcVar37,0);
        pcStack_270 = (code *)0x136c4e;
        test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
        pcVar37 = (char *)pbVar43;
        goto LAB_00136c4e;
      }
LAB_001369da:
      switch(bVar10) {
      case 0xcc:
        uVar39 = (ulong)pbVar38[-1];
        pbVar20 = pbVar38;
        break;
      case 0xcd:
        uVar39 = (ulong)(ushort)(*(ushort *)(pbVar38 + -1) << 8 | *(ushort *)(pbVar38 + -1) >> 8);
        pbVar20 = local_22f + lVar5 + -6;
        break;
      case 0xce:
        uVar19 = *(uint *)(pbVar38 + -1);
        uVar39 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                        uVar19 << 0x18);
        pbVar20 = local_22f + lVar5 + -4;
        break;
      case 0xcf:
        uVar39 = *(ulong *)(pbVar38 + -1);
        uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
        pbVar20 = local_22f + lVar5;
        break;
      case 0xd0:
        uVar39 = CONCAT71(0x140c,pbVar38[-1]);
        pbVar20 = local_22f + lVar5 + -7;
        goto LAB_00136a7a;
      case 0xd1:
        pbVar20 = pbVar38 + 1;
        uVar39 = (ulong)(short)(*(ushort *)(pbVar38 + -1) << 8 | *(ushort *)(pbVar38 + -1) >> 8);
        goto LAB_00136a6d;
      case 0xd2:
        uVar19 = *(uint *)(pbVar38 + -1);
        pbVar20 = local_22f + lVar5 + -4;
        uVar39 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        goto LAB_00136a6d;
      case 0xd3:
        uVar39 = *(ulong *)(pbVar38 + -1);
        uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
        pbVar20 = local_22f + lVar5;
LAB_00136a6d:
        if ((long)(char)uVar39 == uVar39) goto LAB_00136a7a;
        goto LAB_0013693f;
      default:
        if ((char)bVar10 < -0x20) goto LAB_0013693f;
        iVar2 = 1;
        iVar3 = 0;
        uVar39 = CONCAT71((int7)((ulong)pFVar11 >> 8),bVar10) & 0xffffffff;
        pbVar20 = local_22f + lVar5 + -8;
        goto LAB_00136a81;
      }
      if (uVar39 < 0x80) {
LAB_00136a7a:
        iVar2 = 1;
        iVar3 = 0;
      }
      else {
LAB_0013693f:
        uVar39 = 0;
        iVar3 = 1;
        iVar2 = 0;
        pbVar20 = pbVar21;
      }
LAB_00136a81:
      if ((char)local_254 == '\0') {
        pcStack_270 = (code *)0x136b47;
        _ok(iVar3,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
        pacVar12 = (char (*) [16])(ulong)(pbVar21 == pbVar20);
        pcVar37 = "mp_num_pos2 == mp_nums[i]";
        pFVar11 = (FILE *)0x738;
        pcStack_270 = (code *)0x136b6d;
        _ok((uint)(pbVar21 == pbVar20),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      else {
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x136ac4;
        local_248 = uVar35;
        _ok(iVar2,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
        uVar19 = (uint)((byte *)pcVar37 == pbVar20);
        uVar26 = 0x154d67;
        pcStack_270 = (code *)0x136aea;
        _ok((uint)((byte *)pcVar37 == pbVar20),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        cVar31 = (char)uVar39;
        if ((int)local_25c < 0) {
          pbVar9 = pbVar43;
          uVar35 = uVar39;
          if (-1 < cVar31) {
LAB_00136c4e:
            pcStack_270 = test_read_num<short,int,int(*)(char_const**,short*)>;
            test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
            builtin_strncpy(acStack_3a0,"typed read of ",0xf);
            uVar39 = (ulong)(int)uVar19;
            if ((int)uVar19 < 0) {
              pcVar42 = "%lld";
              uVar29 = uVar39;
            }
            else {
              pcVar42 = "%llu";
              uVar29 = (ulong)uVar19;
            }
            pcStack_4d8 = (code *)0x136cd6;
            uStack_4c4 = uVar19;
            uStack_4bc = uVar26;
            pbStack_298 = pbVar20;
            pcStack_290 = pcVar16;
            uStack_288 = uVar35;
            pbStack_280 = pbVar38;
            pbStack_278 = (byte *)pcVar37;
            pcStack_270 = (code *)pbVar9;
            iVar2 = snprintf(acStack_3a0 + 0xe,0xf2,pcVar42,uVar29);
            pcVar16 = acStack_3a0 + 0xe + iVar2;
            iVar3 = 0;
            pcStack_4d8 = (code *)0x136cf5;
            iVar2 = snprintf(pcVar16,(long)abStack_2a0 - (long)pcVar16," into ");
            pcVar37 = (char *)(abStack_2a0 + -(long)(pcVar16 + iVar2));
            pcStack_4d8 = (code *)0x136d14;
            snprintf(pcVar16 + iVar2,(size_t)pcVar37,"int%zu_t",0x10);
            pcStack_4d8 = (code *)0x136d23;
            _space((FILE *)_stdout);
            pcStack_4d8 = (code *)0x136d3c;
            fwrite("# ",2,1,_stdout);
            pcStack_4d8 = (code *)0x136d4c;
            fputs(acStack_3a0,_stdout);
            pcStack_4d8 = (code *)0x136d59;
            fputc(10,_stdout);
            if (-1 < (int)uStack_4c4) {
              pcStack_4d8 = (code *)0x136d6d;
              iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_4a0,(ulong)uVar19);
            }
            pacVar12 = (char (*) [16])(&bStack_4a0 + (long)iVar3 * 0x10);
            pcStack_4d8 = (code *)0x136d8f;
            uStack_4b8 = uVar39;
            iVar2 = test_encode_int_all_sizes(pacVar12,uVar39);
            uVar19 = iVar3 + iVar2;
            if (uVar19 == 0 || SCARRY4(iVar3,iVar2) != (int)uVar19 < 0) {
              return;
            }
            fStack_4c0 = (float)(int)uStack_4c4;
            dStack_4a8 = (double)(int)uStack_4c4;
            pbVar38 = (byte *)(ulong)uVar19;
            pbVar9 = (byte *)((long)&uStack_49f + 1);
            uVar35 = 0;
            goto LAB_00136dbd;
          }
          uVar19 = (uint)cVar31;
          pcVar37 = "(int64_t)num1 == (int64_t)num2";
          pFVar11 = (FILE *)0x746;
        }
        else {
          if (cVar31 < '\0') {
LAB_00136bf7:
            pcStack_270 = (code *)0x136bfc;
            test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
LAB_00136bfc:
            pcStack_270 = (code *)0x136c1b;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          uVar19 = (uint)uVar39 & 0xff;
          pcVar37 = "(uint64_t)num1 == (uint64_t)num2";
          pFVar11 = (FILE *)0x743;
        }
        pacVar12 = (char (*) [16])(ulong)(uVar19 == local_25c);
        pcStack_270 = (code *)0x136baa;
        _ok((uint)(uVar19 == local_25c),pcVar37,
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            (int)pFVar11,"check int number");
        pbVar21 = pbVar43;
        uVar35 = local_248;
      }
      pcVar16 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      uVar35 = uVar35 + 1;
      pbVar38 = pbVar38 + 0x10;
      pbVar43 = pbVar43 + -1;
      pbVar9 = pbVar21;
    } while (pbVar43 != (byte *)0x0);
  }
  return;
LAB_00136dbd:
  uVar19 = (uint)pacVar12;
  lVar5 = uVar35 * 0x10;
  pbVar21 = &bStack_4a0 + lVar5;
  pcVar16 = (char *)(pbVar9 + -2);
  bVar10 = pbVar9[-2];
  uVar39 = (ulong)bVar10;
  uVar29 = (ulong)(uint)(int)(char)bVar10;
  mVar1 = mp_type_hint[uVar39];
  pbVar43 = pbVar9;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_00137199:
        pcStack_4d8 = (code *)0x1371b8;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar27 = *(uint *)(pbVar9 + -1);
      fVar15 = (float)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                      uVar27 << 0x18);
      if ((fVar15 == fStack_4c0) && (!NAN(fVar15) && !NAN(fStack_4c0))) {
        pbVar43 = pbVar9 + 3;
        goto LAB_00136eca;
      }
      pcStack_4d8 = (code *)0x1371bd;
      test_read_num<short,int,int(*)(char_const**,short*)>();
LAB_001371bd:
      pcStack_4d8 = (code *)0x1371c2;
      test_read_num<short,int,int(*)(char_const**,short*)>();
      goto LAB_001371c2;
    }
    if (mVar1 == MP_INT) {
      uVar39 = (ulong)(char)bVar10;
      uVar27 = 0x140cbc;
      switch(bVar10) {
      case 0xd0:
        uVar39 = (ulong)(char)pbVar9[-1];
        uVar19 = uVar27;
        break;
      case 0xd1:
        uVar39 = (ulong)(short)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
        pbVar43 = abStack_497 + lVar5 + -6;
        uVar19 = uVar27;
        break;
      case 0xd2:
        uVar19 = *(uint *)(pbVar9 + -1);
        uVar39 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        pbVar43 = abStack_497 + lVar5 + -4;
        uVar19 = uVar27;
        break;
      case 0xd3:
        uVar39 = *(ulong *)(pbVar9 + -1);
        uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
        pbVar43 = abStack_497 + lVar5;
        uVar19 = uVar27;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_4d8 = (code *)0x13716b;
          test_read_num<short,int,int(*)(char_const**,short*)>();
          goto LAB_0013716b;
        }
        pbVar43 = abStack_497 + lVar5 + -8;
      }
      if (uVar39 != uStack_4b8) goto LAB_001371bd;
      goto LAB_00136f5f;
    }
    if (bVar10 != 0xcb) goto LAB_00137175;
    uVar39 = *(ulong *)(pbVar9 + -1);
    dVar18 = (double)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                      (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                      (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                      (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
    if ((dVar18 != dStack_4a8) || (NAN(dVar18) || NAN(dStack_4a8))) {
      pcStack_4d8 = (code *)0x137199;
      test_read_num<short,int,int(*)(char_const**,short*)>();
      goto LAB_00137199;
    }
    pbVar43 = abStack_497 + lVar5;
    goto LAB_00136eca;
  }
  uVar27 = 0x140cac;
  switch(bVar10) {
  case 0xcc:
    uVar39 = (ulong)pbVar9[-1];
    uVar19 = uVar27;
    break;
  case 0xcd:
    uVar39 = (ulong)(ushort)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
    pbVar43 = abStack_497 + lVar5 + -6;
    uVar19 = uVar27;
    break;
  case 0xce:
    uVar19 = *(uint *)(pbVar9 + -1);
    uVar39 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    pbVar43 = abStack_497 + lVar5 + -4;
    uVar19 = uVar27;
    break;
  case 0xcf:
    uVar39 = *(ulong *)(pbVar9 + -1);
    uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
             (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
             (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28 |
             uVar39 << 0x38;
    pbVar43 = abStack_497 + lVar5;
    uVar19 = uVar27;
    break;
  default:
    if (-1 < (char)bVar10) {
      pbVar43 = abStack_497 + lVar5 + -8;
      break;
    }
LAB_0013716b:
    pcStack_4d8 = (code *)0x137170;
    test_read_num<short,int,int(*)(char_const**,short*)>();
    goto LAB_00137170;
  }
  if (uVar39 != uStack_4b8) {
LAB_001371c2:
    pcStack_4d8 = (code *)0x1371c7;
    test_read_num<short,int,int(*)(char_const**,short*)>();
    pbVar43 = pbVar38;
    goto LAB_001371c7;
  }
LAB_00136f5f:
  switch(bVar10) {
  case 0xcc:
    uVar29 = (ulong)pbVar9[-1];
    goto LAB_00136f8e;
  case 0xcd:
    pbVar21 = pbVar9 + 1;
    uVar29 = (ulong)(ushort)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
    goto LAB_00136fcc;
  case 0xce:
    uVar19 = *(uint *)(pbVar9 + -1);
    uVar29 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    pbVar21 = abStack_497 + lVar5 + -4;
    goto LAB_00136fcc;
  case 0xcf:
    uVar39 = *(ulong *)(pbVar9 + -1);
    uVar29 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
             (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
             (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28 |
             uVar39 << 0x38;
    pbVar21 = abStack_497 + lVar5;
LAB_00136fcc:
    if (uVar29 < 0x8000) break;
LAB_00136eca:
    uVar29 = 0;
    iVar3 = 1;
    iVar2 = 0;
    pbVar21 = (byte *)pcVar16;
    goto LAB_00137017;
  case 0xd0:
    uVar29 = (ulong)(uint)(int)(char)pbVar9[-1];
LAB_00136f8e:
    pbVar21 = abStack_497 + lVar5 + -7;
    break;
  case 0xd1:
    uVar29 = (ulong)(ushort)(*(ushort *)(pbVar9 + -1) << 8 | *(ushort *)(pbVar9 + -1) >> 8);
    pbVar21 = abStack_497 + lVar5 + -6;
    break;
  case 0xd2:
    uVar19 = *(uint *)(pbVar9 + -1);
    pbVar21 = pbVar9 + 3;
    uVar29 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18);
    goto LAB_00136ff7;
  case 0xd3:
    uVar39 = *(ulong *)(pbVar9 + -1);
    uVar29 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
             (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
             (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28 |
             uVar39 << 0x38;
    pbVar21 = abStack_497 + lVar5;
LAB_00136ff7:
    if ((long)(short)uVar29 == uVar29) break;
    goto LAB_00136eca;
  default:
    if ((char)bVar10 < -0x20) goto LAB_00136eca;
    pbVar21 = abStack_497 + lVar5 + -8;
  }
  iVar2 = 1;
  iVar3 = 0;
LAB_00137017:
  if ((char)uStack_4bc == '\0') {
    pcVar37 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x1370db;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pacVar12 = (char (*) [16])(ulong)((byte *)pcVar16 == pbVar21);
    pcStack_4d8 = (code *)0x137101;
    _ok((uint)((byte *)pcVar16 == pbVar21),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x13705a;
    uStack_4b0 = uVar35;
    _ok(iVar2,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    uVar19 = (uint)(pbVar43 == pbVar21);
    pcStack_4d8 = (code *)0x137080;
    _ok((uint)(pbVar43 == pbVar21),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    sVar34 = (short)uVar29;
    pcVar37 = (char *)pbVar38;
    if ((int)uStack_4c4 < 0) {
      uVar35 = uVar29;
      if (-1 < sVar34) {
LAB_001371c7:
        pcStack_4d8 = test_read_num<int,int,int(*)(char_const**,int*)>;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        builtin_strncpy(acStack_608,"typed read of ",0xf);
        uVar39 = (ulong)(int)uVar19;
        if ((int)uVar19 < 0) {
          pcVar42 = "%lld";
          uVar29 = uVar39;
        }
        else {
          pcVar42 = "%llu";
          uVar29 = (ulong)uVar19;
        }
        pcStack_730 = (code *)0x137249;
        uStack_728 = uVar19;
        pbStack_500 = pbVar21;
        pbStack_4f8 = (byte *)pcVar37;
        uStack_4f0 = uVar35;
        pbStack_4e8 = pbVar9;
        pbStack_4e0 = pbVar43;
        pcStack_4d8 = (code *)pcVar16;
        iVar2 = snprintf(acStack_608 + 0xe,0xf2,pcVar42,uVar29);
        pcVar37 = acStack_608 + 0xe + iVar2;
        iVar3 = 0;
        pcStack_730 = (code *)0x137267;
        iVar2 = snprintf(pcVar37,(size_t)(auStack_508 + -(long)pcVar37)," into ");
        pcStack_730 = (code *)0x137286;
        snprintf(pcVar37 + iVar2,(size_t)(auStack_508 + -(long)(pcVar37 + iVar2)),"int%zu_t",0x20);
        pcStack_730 = (code *)0x137295;
        _space((FILE *)_stdout);
        pcStack_730 = (code *)0x1372ae;
        fwrite("# ",2,1,_stdout);
        pcStack_730 = (code *)0x1372be;
        fputs(acStack_608,_stdout);
        pcStack_730 = (code *)0x1372cb;
        fputc(10,_stdout);
        uVar27 = uStack_728;
        if (-1 < (int)uStack_728) {
          pcStack_730 = (code *)0x1372e1;
          iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_708,(ulong)uVar19);
        }
        pacVar12 = (char (*) [16])(&bStack_708 + (long)iVar3 * 0x10);
        pcStack_730 = (code *)0x137302;
        uStack_720 = uVar39;
        iVar2 = test_encode_int_all_sizes(pacVar12,uVar39);
        uVar19 = iVar3 + iVar2;
        if (uVar19 == 0 || SCARRY4(iVar3,iVar2) != (int)uVar19 < 0) {
          return;
        }
        fStack_724 = (float)(int)uVar27;
        dStack_710 = (double)(int)uVar27;
        uStack_718 = (ulong)uVar19;
        puVar24 = (undefined1 *)((long)&uStack_707 + 1);
        lVar5 = 0;
        uVar35 = (ulong)uVar19;
        goto LAB_0013732e;
      }
      uVar19 = (uint)sVar34;
      pcVar16 = "(int64_t)num1 == (int64_t)num2";
      iVar2 = 0x746;
    }
    else {
      if (sVar34 < 0) {
LAB_00137170:
        pcStack_4d8 = (code *)0x137175;
        test_read_num<short,int,int(*)(char_const**,short*)>();
LAB_00137175:
        pcStack_4d8 = (code *)0x137194;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      uVar19 = (uint)uVar29 & 0xffff;
      pcVar16 = "(uint64_t)num1 == (uint64_t)num2";
      iVar2 = 0x743;
    }
    pacVar12 = (char (*) [16])(ulong)(uVar19 == uStack_4c4);
    pcStack_4d8 = (code *)0x13713f;
    _ok((uint)(uVar19 == uStack_4c4),pcVar16,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar2,"check int number");
    uVar35 = uStack_4b0;
  }
  uVar35 = uVar35 + 1;
  pbVar9 = pbVar9 + 0x10;
  pbVar38 = pbVar38 + -1;
  if (pbVar38 == (byte *)0x0) {
    return;
  }
  goto LAB_00136dbd;
LAB_0013732e:
  lVar6 = lVar5 * 0x10;
  bVar10 = puVar24[-2];
  uVar39 = (ulong)bVar10;
  uVar29 = (ulong)(uint)(int)(char)bVar10;
  mVar1 = mp_type_hint[uVar39];
  puVar13 = puVar24;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) goto LAB_00137660;
      uVar19 = *(uint *)(puVar24 + -1);
      fVar15 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      if ((fVar15 != fStack_724) || (NAN(fVar15) || NAN(fStack_724))) {
        pcStack_730 = (code *)0x137684;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_00137684;
      }
      puVar13 = puVar24 + 3;
      goto LAB_0013742e;
    }
    if (mVar1 == MP_INT) {
      uVar39 = (ulong)(char)bVar10;
      iVar2 = bVar10 - 0xd0;
      puVar28 = &switchD_00137390::switchdataD_00140cfc;
      switch(iVar2) {
      case 0:
        uVar39 = (ulong)(char)puVar24[-1];
        break;
      case 1:
        uVar39 = (ulong)(short)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
        puVar13 = auStack_6ff + lVar6 + -6;
        break;
      case 2:
        uVar19 = *(uint *)(puVar24 + -1);
        uVar39 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        puVar13 = auStack_6ff + lVar6 + -4;
        break;
      case 3:
        uVar39 = *(ulong *)(puVar24 + -1);
        uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
        puVar13 = auStack_6ff + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_730 = (code *)0x13764c;
          test_read_num<int,int,int(*)(char_const**,int*)>();
          goto LAB_0013764c;
        }
        puVar28 = (uint *)pacVar12;
        puVar13 = auStack_6ff + lVar6 + -8;
      }
      if (uVar39 != uStack_720) {
        pcStack_730 = (code *)0x1376a8;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_001376a8;
      }
      goto LAB_001374bc;
    }
    if (bVar10 != 0xcb) {
LAB_00137684:
      pcStack_730 = (code *)0x1376a3;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar35 = *(ulong *)(puVar24 + -1);
    dVar18 = (double)(uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                      (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                      (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                      (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38);
    if ((dVar18 == dStack_710) && (!NAN(dVar18) && !NAN(dStack_710))) {
      puVar13 = auStack_6ff + lVar6;
      goto LAB_0013742e;
    }
    goto LAB_0013765b;
  }
  iVar2 = bVar10 - 0xcc;
  puVar28 = &switchD_001373ed::switchdataD_00140cec;
  switch(iVar2) {
  case 0:
    uVar39 = (ulong)(byte)puVar24[-1];
    break;
  case 1:
    uVar39 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    puVar13 = auStack_6ff + lVar6 + -6;
    break;
  case 2:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar39 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar13 = auStack_6ff + lVar6 + -4;
    break;
  case 3:
    uVar39 = *(ulong *)(puVar24 + -1);
    uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
             (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
             (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28 |
             uVar39 << 0x38;
    puVar13 = auStack_6ff + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      puVar28 = (uint *)pacVar12;
      puVar13 = auStack_6ff + lVar6 + -8;
      break;
    }
LAB_0013764c:
    pcStack_730 = (code *)0x137651;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    goto LAB_00137651;
  }
  if (uVar39 != uStack_720) {
LAB_001376a8:
    pcStack_730 = test_read_num<int,long,int(*)(char_const**,int*)>;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    builtin_strncpy(acStack_860,"typed read of ",0xf);
    pcVar16 = "%lld";
    if (-1 < (long)puVar28) {
      pcVar16 = "%llu";
    }
    iVar3 = 0;
    pcStack_988 = (code *)0x13771d;
    iStack_974 = iVar2;
    uStack_758 = uVar35;
    pcStack_750 = pcVar37;
    puStack_748 = puVar24 + -2;
    lStack_740 = lVar5;
    puStack_738 = puVar13;
    pcStack_730 = (code *)puVar24;
    iVar2 = snprintf(acStack_860 + 0xe,0xf2,pcVar16,puVar28);
    pbVar9 = (byte *)(acStack_860 + (long)iVar2 + 0xe);
    pcStack_988 = (code *)0x137741;
    iVar2 = snprintf((char *)pbVar9,(size_t)(auStack_760 + -(long)pbVar9)," into ");
    pcStack_988 = (code *)0x137760;
    snprintf((char *)(pbVar9 + iVar2),(size_t)(auStack_760 + -(long)(pbVar9 + iVar2)),"int%zu_t",
             0x20);
    pcStack_988 = (code *)0x13776f;
    _space((FILE *)_stdout);
    pcStack_988 = (code *)0x137788;
    fwrite("# ",2,1,_stdout);
    pcStack_988 = (code *)0x137798;
    fputs(acStack_860,_stdout);
    pcStack_988 = (code *)0x1377a5;
    fputc(10,_stdout);
    pacStack_980 = (char (*) [16])puVar28;
    if (-1 < (long)puVar28) {
      pcStack_988 = (code *)0x1377bb;
      iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_960,(uint64_t)puVar28);
    }
    pacVar12 = (char (*) [16])(&bStack_960 + (long)iVar3 * 0x10);
    pcStack_988 = (code *)0x1377d8;
    iVar2 = test_encode_int_all_sizes(pacVar12,(int64_t)pacStack_980);
    uVar19 = iVar3 + iVar2;
    if (uVar19 == 0 || SCARRY4(iVar3,iVar2) != (int)uVar19 < 0) {
      return;
    }
    fStack_978 = (float)(long)pacStack_980;
    dStack_968 = (double)(long)pacStack_980;
    pbVar43 = (byte *)(ulong)uVar19;
    pbVar38 = (byte *)((long)&uStack_95f + 1);
    uVar35 = 0;
    goto LAB_00137808;
  }
LAB_001374bc:
  switch(bVar10) {
  case 0xcc:
    uVar29 = (ulong)(byte)puVar24[-1];
    goto LAB_001374e9;
  case 0xcd:
    puVar7 = auStack_6ff + lVar6 + -6;
    uVar29 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar29 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar7 = puVar24 + 3;
    goto LAB_00137505;
  case 0xcf:
    uVar35 = *(ulong *)(puVar24 + -1);
    uVar29 = uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
             (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
             (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28 |
             uVar35 << 0x38;
    puVar7 = auStack_6ff + lVar6;
LAB_00137505:
    if (uVar29 < 0x80000000) break;
LAB_0013742e:
    uVar29 = 0;
    iVar2 = 0;
    puVar7 = puVar24 + -2;
    goto LAB_0013755f;
  case 0xd0:
    uVar29 = (ulong)(uint)(int)(char)puVar24[-1];
LAB_001374e9:
    puVar7 = auStack_6ff + lVar6 + -7;
    break;
  case 0xd1:
    puVar7 = auStack_6ff + lVar6 + -6;
    uVar29 = (ulong)(uint)(int)(short)(*(ushort *)(puVar24 + -1) << 8 |
                                      *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar29 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar7 = auStack_6ff + lVar6 + -4;
    break;
  case 0xd3:
    uVar35 = *(ulong *)(puVar24 + -1);
    uVar39 = uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
             (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8;
    uVar29 = uVar39 | (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
             (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38;
    if ((long)(int)uVar39 == uVar29) {
      puVar7 = auStack_6ff + lVar6;
      break;
    }
    goto LAB_0013742e;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013742e;
    iVar2 = 1;
    puVar7 = auStack_6ff + lVar6 + -8;
    goto LAB_0013755f;
  }
  iVar2 = 1;
LAB_0013755f:
  pcVar37 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_730 = (code *)0x137583;
  _ok(iVar2,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X");
  pcStack_730 = (code *)0x1375a9;
  _ok((uint)(puVar13 == puVar7),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar19 = (uint)uVar29;
  if ((int)uStack_728 < 0) {
    if (-1 < (int)uVar19) goto LAB_00137656;
    pcVar16 = "(int64_t)num1 == (int64_t)num2";
    iVar2 = 0x746;
  }
  else {
    if ((int)uVar19 < 0) {
LAB_00137651:
      pcStack_730 = (code *)0x137656;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_00137656:
      pcStack_730 = (code *)0x13765b;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0013765b:
      pcStack_730 = (code *)0x137660;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_00137660:
      pcStack_730 = (code *)0x13767f;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar16 = "(uint64_t)num1 == (uint64_t)num2";
    iVar2 = 0x743;
  }
  pacVar12 = (char (*) [16])(ulong)(uVar19 == uStack_728);
  pcStack_730 = (code *)0x137602;
  _ok((uint)(uVar19 == uStack_728),pcVar16,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      "check int number");
  lVar5 = lVar5 + 1;
  puVar24 = puVar24 + 0x10;
  uStack_718 = uStack_718 - 1;
  uVar35 = uVar29;
  if (uStack_718 == 0) {
    return;
  }
  goto LAB_0013732e;
LAB_00137808:
  uVar19 = (uint)pacVar12;
  lVar5 = uVar35 * 0x10;
  pbVar17 = &bStack_960 + lVar5;
  pbVar21 = pbVar38 + -2;
  bVar10 = pbVar38[-2];
  pacVar12 = (char (*) [16])(ulong)bVar10;
  uVar39 = (ulong)(uint)(int)(char)bVar10;
  mVar1 = mp_type_hint[(long)pacVar12];
  pbVar20 = pbVar38;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_00137bd8:
        pcStack_988 = (code *)0x137bf7;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar27 = *(uint *)(pbVar38 + -1);
      fVar15 = (float)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                      uVar27 << 0x18);
      if ((fVar15 == fStack_978) && (!NAN(fVar15) && !NAN(fStack_978))) {
        pbVar20 = pbVar38 + 3;
        goto LAB_0013790e;
      }
      pcStack_988 = (code *)0x137bfc;
      test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bfc:
      pcStack_988 = (code *)0x137c01;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00137c01;
    }
    if (mVar1 == MP_INT) {
      pacVar12 = (char (*) [16])(long)(char)bVar10;
      switch(bVar10) {
      case 0xd0:
        pacVar12 = (char (*) [16])(long)(char)pbVar38[-1];
        break;
      case 0xd1:
        pacVar12 = (char (*) [16])
                   (long)(short)(*(ushort *)(pbVar38 + -1) << 8 | *(ushort *)(pbVar38 + -1) >> 8);
        pbVar20 = abStack_957 + lVar5 + -6;
        break;
      case 0xd2:
        uVar27 = *(uint *)(pbVar38 + -1);
        pacVar12 = (char (*) [16])
                   (long)(int)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                              uVar27 << 0x18);
        pbVar20 = abStack_957 + lVar5 + -4;
        break;
      case 0xd3:
        uVar29 = *(ulong *)(pbVar38 + -1);
        pacVar12 = (char (*) [16])
                   (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                    (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                    (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                    (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
        pbVar20 = abStack_957 + lVar5;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_988 = (code *)0x137baa;
          test_read_num<int,long,int(*)(char_const**,int*)>();
          goto LAB_00137baa;
        }
        pbVar20 = abStack_957 + lVar5 + -8;
      }
      if (pacVar12 != pacStack_980) goto LAB_00137bfc;
      goto LAB_0013799d;
    }
    if (bVar10 != 0xcb) goto LAB_00137bb4;
    uVar39 = *(ulong *)(pbVar38 + -1);
    dVar18 = (double)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                      (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                      (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                      (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
    if ((dVar18 != dStack_968) || (NAN(dVar18) || NAN(dStack_968))) {
      pcStack_988 = (code *)0x137bd8;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00137bd8;
    }
    pbVar20 = abStack_957 + lVar5;
    goto LAB_0013790e;
  }
  switch(bVar10) {
  case 0xcc:
    pacVar12 = (char (*) [16])(ulong)pbVar38[-1];
    break;
  case 0xcd:
    pacVar12 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pbVar38 + -1) << 8 | *(ushort *)(pbVar38 + -1) >> 8);
    pbVar20 = abStack_957 + lVar5 + -6;
    break;
  case 0xce:
    uVar27 = *(uint *)(pbVar38 + -1);
    pacVar12 = (char (*) [16])
               (ulong)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                      uVar27 << 0x18);
    pbVar20 = abStack_957 + lVar5 + -4;
    break;
  case 0xcf:
    uVar29 = *(ulong *)(pbVar38 + -1);
    pacVar12 = (char (*) [16])
               (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28
               | uVar29 << 0x38);
    pbVar20 = abStack_957 + lVar5;
    break;
  default:
    if (-1 < (char)bVar10) {
      pbVar20 = abStack_957 + lVar5 + -8;
      break;
    }
LAB_00137baa:
    pcStack_988 = (code *)0x137baf;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_00137baf;
  }
  if (pacVar12 != pacStack_980) {
LAB_00137c01:
    pcStack_988 = (code *)0x137c06;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    pbVar20 = pbVar43;
    pcVar37 = (char *)puVar28;
    goto LAB_00137c06;
  }
LAB_0013799d:
  switch(bVar10) {
  case 0xcc:
    uVar39 = (ulong)pbVar38[-1];
    goto LAB_001379ca;
  case 0xcd:
    pbVar17 = abStack_957 + lVar5 + -6;
    uVar39 = (ulong)(ushort)(*(ushort *)(pbVar38 + -1) << 8 | *(ushort *)(pbVar38 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(pbVar38 + -1);
    uVar39 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    pbVar17 = pbVar38 + 3;
    goto LAB_001379e6;
  case 0xcf:
    uVar39 = *(ulong *)(pbVar38 + -1);
    uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
             (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
             (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28 |
             uVar39 << 0x38;
    pbVar17 = abStack_957 + lVar5;
LAB_001379e6:
    if (uVar39 < 0x80000000) break;
LAB_0013790e:
    uVar39 = 0;
    iVar3 = 1;
    iVar2 = 0;
    pbVar17 = pbVar21;
    goto LAB_00137a3f;
  case 0xd0:
    uVar39 = (ulong)(uint)(int)(char)pbVar38[-1];
LAB_001379ca:
    pbVar17 = abStack_957 + lVar5 + -7;
    break;
  case 0xd1:
    pbVar17 = abStack_957 + lVar5 + -6;
    uVar39 = (ulong)(uint)(int)(short)(*(ushort *)(pbVar38 + -1) << 8 |
                                      *(ushort *)(pbVar38 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(pbVar38 + -1);
    uVar39 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    pbVar17 = abStack_957 + lVar5 + -4;
    break;
  case 0xd3:
    uVar39 = *(ulong *)(pbVar38 + -1);
    uVar29 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
             (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8;
    uVar39 = uVar29 | (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
             (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
    if ((long)(int)uVar29 == uVar39) {
      pbVar17 = abStack_957 + lVar5;
      break;
    }
    goto LAB_0013790e;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013790e;
    iVar2 = 1;
    iVar3 = 0;
    pbVar17 = abStack_957 + lVar5 + -8;
    goto LAB_00137a3f;
  }
  iVar2 = 1;
  iVar3 = 0;
LAB_00137a3f:
  if ((char)iStack_974 == '\0') {
    pcStack_988 = (code *)0x137b01;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X");
    pacVar12 = (char (*) [16])(ulong)(pbVar21 == pbVar17);
    pcStack_988 = (code *)0x137b27;
    _ok((uint)(pbVar21 == pbVar17),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcVar37 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_988 = (code *)0x137a7e;
    uStack_970 = uVar35;
    _ok(iVar2,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X");
    uVar19 = (uint)(pbVar20 == pbVar17);
    pcStack_988 = (code *)0x137aa4;
    _ok((uint)(pbVar20 == pbVar17),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    iVar2 = (int)uVar39;
    if ((long)pacStack_980 < 0) {
      pbVar9 = pbVar43;
      uVar35 = uVar39;
      if (-1 < iVar2) {
LAB_00137c06:
        pcStack_988 = test_read_num<long,int,int(*)(char_const**,long*)>;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_ab8,"typed read of ",0xf);
        uVar39 = (ulong)(int)uVar19;
        if ((int)uVar19 < 0) {
          pcVar16 = "%lld";
          uVar29 = uVar39;
        }
        else {
          pcVar16 = "%llu";
          uVar29 = (ulong)uVar19;
        }
        pcStack_bf0 = (code *)0x137c8b;
        uStack_bdc = uVar19;
        pbStack_9b0 = pbVar17;
        pbStack_9a8 = pbVar9;
        pbStack_9a0 = pbVar20;
        pacStack_998 = (char (*) [16])pcVar37;
        uStack_990 = uVar35;
        pcStack_988 = (code *)pbVar38;
        iVar2 = snprintf(acStack_ab8 + 0xe,0xf2,pcVar16,uVar29);
        pcVar16 = acStack_ab8 + 0xe + iVar2;
        iVar3 = 0;
        pcStack_bf0 = (code *)0x137ca9;
        iVar2 = snprintf(pcVar16,(size_t)(acStack_9b8 + -(long)pcVar16)," into ");
        pcVar37 = acStack_9b8 + -(long)(pcVar16 + iVar2);
        pcStack_bf0 = (code *)0x137cc8;
        snprintf(pcVar16 + iVar2,(size_t)pcVar37,"int%zu_t",0x40);
        pcStack_bf0 = (code *)0x137cd7;
        _space((FILE *)_stdout);
        pcStack_bf0 = (code *)0x137cf0;
        fwrite("# ",2,1,_stdout);
        pcStack_bf0 = (code *)0x137d00;
        fputs(acStack_ab8,_stdout);
        pcStack_bf0 = (code *)0x137d0d;
        fputc(10,_stdout);
        if (-1 < (int)uStack_bdc) {
          pcStack_bf0 = (code *)0x137d21;
          iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_bb8,(ulong)uVar19);
        }
        pacVar12 = (char (*) [16])(&bStack_bb8 + (long)iVar3 * 0x10);
        pcStack_bf0 = (code *)0x137d3d;
        iVar2 = test_encode_int_all_sizes(pacVar12,uVar39);
        uVar19 = iVar3 + iVar2;
        if (uVar19 == 0 || SCARRY4(iVar3,iVar2) != (int)uVar19 < 0) {
          return;
        }
        fStack_bcc = (float)(int)uStack_bdc;
        dStack_bc0 = (double)(int)uStack_bdc;
        uStack_bc8 = (ulong)uVar19;
        puVar24 = (undefined1 *)((long)&uStack_bb7 + 1);
        lVar5 = 0;
        uStack_bd8 = uVar39;
        goto LAB_00137d70;
      }
      pacVar8 = (char (*) [16])(long)iVar2;
      pcVar37 = "(int64_t)num1 == (int64_t)num2";
      iVar2 = 0x746;
    }
    else {
      if (iVar2 < 0) {
LAB_00137baf:
        pcStack_988 = (code *)0x137bb4;
        test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bb4:
        pcStack_988 = (code *)0x137bd3;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pacVar8 = (char (*) [16])(uVar39 & 0xffffffff);
      pcVar37 = "(uint64_t)num1 == (uint64_t)num2";
      iVar2 = 0x743;
    }
    pacVar12 = (char (*) [16])(ulong)(pacVar8 == pacStack_980);
    pcStack_988 = (code *)0x137b62;
    _ok((uint)(pacVar8 == pacStack_980),pcVar37,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar2,"check int number");
    pbVar21 = pbVar43;
    uVar35 = uStack_970;
  }
  uVar35 = uVar35 + 1;
  pbVar38 = pbVar38 + 0x10;
  pbVar43 = pbVar43 + -1;
  pbVar9 = pbVar21;
  puVar28 = (uint *)
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  if (pbVar43 == (byte *)0x0) {
    return;
  }
  goto LAB_00137808;
LAB_00137d70:
  lVar6 = lVar5 * 0x10;
  puVar13 = puVar24 + -2;
  bVar10 = puVar24[-2];
  uVar35 = (ulong)bVar10;
  uVar39 = (ulong)(char)bVar10;
  mVar1 = mp_type_hint[uVar35];
  puVar7 = puVar24;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) goto LAB_0013809f;
      uVar19 = *(uint *)(puVar24 + -1);
      fVar15 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      if ((fVar15 != fStack_bcc) || (NAN(fVar15) || NAN(fStack_bcc))) {
        pcStack_bf0 = (code *)0x1380c3;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380c3;
      }
      puVar7 = puVar24 + 3;
      goto LAB_00137e70;
    }
    if (mVar1 == MP_INT) {
      iVar2 = bVar10 - 0xd0;
      puVar28 = &switchD_00137dd0::switchdataD_00140d7c;
      switch(iVar2) {
      case 0:
        uVar35 = (ulong)(char)puVar24[-1];
        break;
      case 1:
        uVar35 = (ulong)(short)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
        puVar7 = auStack_baf + lVar6 + -6;
        break;
      case 2:
        uVar19 = *(uint *)(puVar24 + -1);
        uVar35 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        puVar7 = auStack_baf + lVar6 + -4;
        break;
      case 3:
        uVar35 = *(ulong *)(puVar24 + -1);
        uVar35 = uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                 (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                 (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                 (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38;
        puVar7 = auStack_baf + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_bf0 = (code *)0x13808b;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013808b;
        }
        uVar35 = uVar39;
        puVar28 = (uint *)pacVar12;
        puVar7 = auStack_baf + lVar6 + -8;
      }
      if (uVar35 != uStack_bd8) {
        pcStack_bf0 = (code *)0x1380e7;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380e7;
      }
      goto LAB_00137f04;
    }
    if (bVar10 != 0xcb) {
LAB_001380c3:
      pcStack_bf0 = (code *)0x1380e2;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar35 = *(ulong *)(puVar24 + -1);
    dVar18 = (double)(uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                      (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                      (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                      (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38);
    if ((dVar18 == dStack_bc0) && (!NAN(dVar18) && !NAN(dStack_bc0))) {
      puVar7 = auStack_baf + lVar6;
      goto LAB_00137e70;
    }
    goto LAB_0013809a;
  }
  iVar2 = bVar10 - 0xcc;
  puVar28 = &switchD_00137e2e::switchdataD_00140d6c;
  switch(iVar2) {
  case 0:
    uVar35 = (ulong)(byte)puVar24[-1];
    break;
  case 1:
    uVar35 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    puVar7 = auStack_baf + lVar6 + -6;
    break;
  case 2:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar35 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar7 = auStack_baf + lVar6 + -4;
    break;
  case 3:
    uVar35 = *(ulong *)(puVar24 + -1);
    uVar35 = uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
             (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
             (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28 |
             uVar35 << 0x38;
    puVar7 = auStack_baf + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      puVar28 = (uint *)pacVar12;
      puVar7 = auStack_baf + lVar6 + -8;
      break;
    }
LAB_0013808b:
    pcStack_bf0 = (code *)0x138090;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00138090;
  }
  if (uVar35 != uStack_bd8) {
LAB_001380e7:
    pcStack_bf0 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_d20,"typed read of ",0xf);
    pcStack_e58 = (code *)0x138151;
    pacStack_e40 = (char (*) [16])puVar28;
    iStack_e34 = iVar2;
    uStack_c18 = uVar39;
    pcStack_c10 = pcVar37;
    lStack_c08 = lVar5;
    puStack_c00 = puVar7;
    puStack_bf8 = puVar24;
    pcStack_bf0 = (code *)puVar13;
    iVar2 = snprintf(acStack_d20 + 0xe,0xf2,"%llu",puVar28);
    pcVar37 = acStack_d20 + (long)iVar2 + 0xe;
    pcStack_e58 = (code *)0x138175;
    iVar2 = snprintf(pcVar37,(size_t)(auStack_c20 + -(long)pcVar37)," into ");
    pcStack_e58 = (code *)0x138194;
    snprintf(pcVar37 + iVar2,(size_t)(auStack_c20 + -(long)(pcVar37 + iVar2)),"int%zu_t",0x40);
    pcStack_e58 = (code *)0x1381a3;
    _space((FILE *)_stdout);
    pcStack_e58 = (code *)0x1381bc;
    fwrite("# ",2,1,_stdout);
    pcStack_e58 = (code *)0x1381cc;
    fputs(acStack_d20,_stdout);
    pcStack_e58 = (code *)0x1381d9;
    fputc(10,_stdout);
    pacVar12 = (char (*) [16])&bStack_e20;
    pcStack_e58 = (code *)0x1381e6;
    pcVar16 = (char *)puVar28;
    uVar19 = test_encode_uint_all_sizes(pacVar12,(uint64_t)puVar28);
    if (-1 < (long)puVar28) {
      pacVar12 = (char (*) [16])(&bStack_e20 + (long)(int)uVar19 * 0x10);
      pcVar16 = (char *)0x7fffffffffffffff;
      pcStack_e58 = (code *)0x13820b;
      iVar2 = test_encode_int_all_sizes(pacVar12,0x7fffffffffffffff);
      uVar19 = uVar19 + iVar2;
    }
    if ((int)uVar19 < 1) {
      return;
    }
    fStack_e44 = (float)pacStack_e40;
    auVar45._8_4_ = (int)((ulong)pacStack_e40 >> 0x20);
    auVar45._0_8_ = pacStack_e40;
    auVar45._12_4_ = 0x45300000;
    dStack_e28 = auVar45._8_8_ - 1.9342813113834067e+25;
    dStack_e30 = dStack_e28 + ((double)CONCAT44(0x43300000,(int)pacStack_e40) - 4503599627370496.0);
    pcVar22 = (char *)(ulong)uVar19;
    pcVar42 = (char *)((long)&uStack_e1f + 1);
    lVar5 = 0;
    goto LAB_00138274;
  }
LAB_00137f04:
  switch(bVar10) {
  case 0xcc:
    uVar39 = (ulong)(byte)puVar24[-1];
    goto LAB_00137f32;
  case 0xcd:
    puVar13 = auStack_baf + lVar6 + -6;
    uVar39 = (ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(puVar24 + -1);
    uVar39 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    puVar13 = auStack_baf + lVar6 + -4;
    break;
  case 0xcf:
    uVar35 = *(ulong *)(puVar24 + -1);
    uVar39 = uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
             (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
             (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28 |
             uVar35 << 0x38;
    if (-1 < (long)uVar39) goto LAB_00137f5c;
LAB_00137e70:
    uVar39 = 0;
    iVar2 = 0;
    goto LAB_00137faa;
  case 0xd0:
    uVar39 = (ulong)(char)puVar24[-1];
LAB_00137f32:
    puVar13 = auStack_baf + lVar6 + -7;
    break;
  case 0xd1:
    puVar13 = auStack_baf + lVar6 + -6;
    uVar39 = (ulong)(short)(*(ushort *)(puVar24 + -1) << 8 | *(ushort *)(puVar24 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(puVar24 + -1);
    puVar13 = auStack_baf + lVar6 + -4;
    uVar39 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18);
    break;
  case 0xd3:
    uVar35 = *(ulong *)(puVar24 + -1);
    uVar39 = uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
             (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
             (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28 |
             uVar35 << 0x38;
LAB_00137f5c:
    puVar13 = auStack_baf + lVar6;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_00137e70;
    puVar13 = auStack_baf + lVar6 + -8;
  }
  iVar2 = 1;
LAB_00137faa:
  pcVar37 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_bf0 = (code *)0x137fd2;
  _ok(iVar2,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
  pcStack_bf0 = (code *)0x137ff8;
  _ok((uint)(puVar7 == puVar13),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  if ((int)uStack_bdc < 0) {
    if (-1 < (long)uVar39) goto LAB_00138095;
    pcVar16 = "(int64_t)num1 == (int64_t)num2";
    iVar2 = 0x746;
  }
  else {
    if ((long)uVar39 < 0) {
LAB_00138090:
      pcStack_bf0 = (code *)0x138095;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00138095:
      pcStack_bf0 = (code *)0x13809a;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809a:
      pcStack_bf0 = (code *)0x13809f;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809f:
      pcStack_bf0 = (code *)0x1380be;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar16 = "(uint64_t)num1 == (uint64_t)num2";
    iVar2 = 0x743;
  }
  pacVar12 = (char (*) [16])(ulong)(uVar39 == uStack_bd8);
  pcStack_bf0 = (code *)0x13805f;
  _ok((uint)(uVar39 == uStack_bd8),pcVar16,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      "check int number");
  lVar5 = lVar5 + 1;
  puVar24 = puVar24 + 0x10;
  uStack_bc8 = uStack_bc8 - 1;
  if (uStack_bc8 == 0) {
    return;
  }
  goto LAB_00137d70;
LAB_00138274:
  lVar6 = lVar5 * 0x10;
  pcVar32 = pcVar42 + -2;
  bVar10 = pcVar42[-2];
  pacVar8 = (char (*) [16])(ulong)bVar10;
  pacVar30 = (char (*) [16])(long)(char)bVar10;
  mVar1 = mp_type_hint[(long)pacVar8];
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_001385f4:
        pcStack_e58 = (code *)0x138613;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar19 = *(uint *)(pcVar42 + -1);
      fVar15 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      if ((fVar15 == fStack_e44) && (!NAN(fVar15) && !NAN(fStack_e44))) {
        pcVar37 = pcVar42 + 3;
        goto LAB_0013837a;
      }
      pcStack_e58 = (code *)0x138618;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00138618:
      pcStack_e58 = (code *)0x13861d;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_0013861d;
    }
    if (mVar1 == MP_INT) {
      switch(bVar10) {
      case 0xd0:
        pacVar8 = (char (*) [16])(long)pcVar42[-1];
        pcVar16 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar37 = pcVar42;
        break;
      case 0xd1:
        pacVar8 = (char (*) [16])
                  (long)(short)(*(ushort *)(pcVar42 + -1) << 8 | *(ushort *)(pcVar42 + -1) >> 8);
        pcVar16 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar37 = acStack_e17 + lVar6 + -6;
        break;
      case 0xd2:
        uVar19 = *(uint *)(pcVar42 + -1);
        pacVar8 = (char (*) [16])
                  (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                             uVar19 << 0x18);
        pcVar16 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar37 = acStack_e17 + lVar6 + -4;
        break;
      case 0xd3:
        uVar35 = *(ulong *)(pcVar42 + -1);
        pacVar8 = (char (*) [16])
                  (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                   (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                   (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                   (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38);
        pcVar16 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar37 = acStack_e17 + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_e58 = (code *)0x1385c6;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_001385c6;
        }
        pacVar8 = pacVar30;
        pcVar37 = acStack_e17 + lVar6 + -8;
      }
      if (pacVar8 != pacStack_e40) goto LAB_00138618;
      goto LAB_0013840f;
    }
    if (bVar10 != 0xcb) goto LAB_001385d0;
    uVar35 = *(ulong *)(pcVar42 + -1);
    dVar18 = (double)(uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                      (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                      (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                      (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38);
    if ((dVar18 != dStack_e30) || (NAN(dVar18) || NAN(dStack_e30))) {
      pcStack_e58 = (code *)0x1385f4;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_001385f4;
    }
    pcVar37 = acStack_e17 + lVar6;
    goto LAB_0013837a;
  }
  switch(bVar10) {
  case 0xcc:
    pacVar8 = (char (*) [16])(ulong)(byte)pcVar42[-1];
    pcVar16 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar37 = pcVar42;
    break;
  case 0xcd:
    pacVar8 = (char (*) [16])
              (ulong)(ushort)(*(ushort *)(pcVar42 + -1) << 8 | *(ushort *)(pcVar42 + -1) >> 8);
    pcVar16 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar37 = acStack_e17 + lVar6 + -6;
    break;
  case 0xce:
    uVar19 = *(uint *)(pcVar42 + -1);
    pacVar8 = (char (*) [16])
              (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                     uVar19 << 0x18);
    pcVar16 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar37 = acStack_e17 + lVar6 + -4;
    break;
  case 0xcf:
    uVar35 = *(ulong *)(pcVar42 + -1);
    pacVar8 = (char (*) [16])
              (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
               (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
               (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28
              | uVar35 << 0x38);
    pcVar16 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar37 = acStack_e17 + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      pcVar37 = acStack_e17 + lVar6 + -8;
      break;
    }
LAB_001385c6:
    pcStack_e58 = (code *)0x1385cb;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    goto LAB_001385cb;
  }
  if (pacVar8 != pacStack_e40) {
LAB_0013861d:
    pcStack_e58 = test_read_num<double,int,int(*)(char_const**,double*)>;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    iVar2 = (int)pacVar12;
    builtin_strncpy(acStack_f88,"typed read of ",0xf);
    pcStack_10b8 = (code *)(long)iVar2;
    if (iVar2 < 0) {
      pcVar32 = "%lld";
      pcVar14 = pcStack_10b8;
    }
    else {
      pcVar32 = "%llu";
      pcVar14 = (code *)((ulong)pacVar12 & 0xffffffff);
    }
    pcStack_10c0 = (code *)0x1386a4;
    pacStack_1090 = (char (*) [16])pcVar16;
    pacStack_e80 = (char (*) [16])pcVar22;
    pcStack_e78 = pcVar37;
    pcStack_e70 = pcVar42;
    pacStack_e68 = (char (*) [16])puVar28;
    lStack_e60 = lVar5;
    pcStack_e58 = (code *)(&bStack_e20 + lVar6);
    iVar3 = snprintf(acStack_f88 + 0xe,0xf2,pcVar32,pcVar14);
    pcVar37 = acStack_f88 + 0xe + iVar3;
    iVar4 = 0;
    pcStack_10c0 = (code *)0x1386c3;
    iVar3 = snprintf(pcVar37,(size_t)(auStack_e88 + -(long)pcVar37)," into ");
    puVar24 = auStack_e88 + -(long)(pcVar37 + iVar3);
    pcStack_10c0 = (code *)0x1386dd;
    snprintf(pcVar37 + iVar3,(size_t)puVar24,"double");
    pcStack_10c0 = (code *)0x1386ec;
    _space((FILE *)_stdout);
    pcStack_10c0 = (code *)0x138705;
    fwrite("# ",2,1,_stdout);
    pcStack_10c0 = (code *)0x138715;
    fputs(acStack_f88,_stdout);
    pcStack_10c0 = (code *)0x138722;
    fputc(10,_stdout);
    if (-1 < iVar2) {
      pcStack_10c0 = (code *)0x138733;
      iVar4 = test_encode_uint_all_sizes
                        ((char (*) [16])&bStack_1088,(uint64_t)((ulong)pacVar12 & 0xffffffff));
    }
    pcVar16 = (char *)(&bStack_1088 + (long)iVar4 * 0x10);
    pcStack_10c0 = (code *)0x138751;
    pcVar37 = (char *)pcStack_10b8;
    iVar3 = test_encode_int_all_sizes((char (*) [16])pcVar16,(int64_t)pcStack_10b8);
    uVar19 = iVar4 + iVar3;
    if (uVar19 == 0 || SCARRY4(iVar4,iVar3) != (int)uVar19 < 0) {
      return;
    }
    fStack_10ac = (float)iVar2;
    dStack_10a8 = (double)iVar2;
    uVar35 = (ulong)uVar19;
    puVar36 = (undefined8 *)(auStack_1087 + 1);
    pcVar42 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    lVar5 = 0;
    goto LAB_00138782;
  }
LAB_0013840f:
  switch(bVar10) {
  case 0xcc:
    pacVar30 = (char (*) [16])(ulong)(byte)pcVar42[-1];
    goto LAB_0013843d;
  case 0xcd:
    pcVar25 = acStack_e17 + lVar6 + -6;
    pacVar30 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pcVar42 + -1) << 8 | *(ushort *)(pcVar42 + -1) >> 8);
    break;
  case 0xce:
    uVar19 = *(uint *)(pcVar42 + -1);
    pacVar30 = (char (*) [16])
               (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
    pcVar25 = acStack_e17 + lVar6 + -4;
    break;
  case 0xcf:
    uVar35 = *(ulong *)(pcVar42 + -1);
    pacVar30 = (char (*) [16])
               (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28
               | uVar35 << 0x38);
    if (-1 < (long)pacVar30) goto LAB_00138468;
LAB_0013837a:
    pacVar30 = (char (*) [16])0x0;
    iVar3 = 1;
    iVar2 = 0;
    pcVar25 = pcVar32;
    goto LAB_001384b7;
  case 0xd0:
    pacVar30 = (char (*) [16])(long)pcVar42[-1];
LAB_0013843d:
    pcVar25 = acStack_e17 + lVar6 + -7;
    break;
  case 0xd1:
    pcVar25 = acStack_e17 + lVar6 + -6;
    pacVar30 = (char (*) [16])
               (long)(short)(*(ushort *)(pcVar42 + -1) << 8 | *(ushort *)(pcVar42 + -1) >> 8);
    break;
  case 0xd2:
    uVar19 = *(uint *)(pcVar42 + -1);
    pcVar25 = acStack_e17 + lVar6 + -4;
    pacVar30 = (char (*) [16])
               (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                          uVar19 << 0x18);
    break;
  case 0xd3:
    uVar35 = *(ulong *)(pcVar42 + -1);
    pacVar30 = (char (*) [16])
               (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28
               | uVar35 << 0x38);
LAB_00138468:
    pcVar25 = acStack_e17 + lVar6;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013837a;
    pcVar25 = acStack_e17 + lVar6 + -8;
  }
  iVar2 = 1;
  iVar3 = 0;
LAB_001384b7:
  if ((char)iStack_e34 == '\0') {
    pcVar40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_e58 = (code *)0x138579;
    _ok(iVar3,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pacVar12 = (char (*) [16])(ulong)(pcVar32 == pcVar25);
    pcVar16 = "mp_num_pos2 == mp_nums[i]";
    pcStack_e58 = (code *)0x13859f;
    _ok((uint)(pcVar32 == pcVar25),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcStack_e58 = (code *)0x1384ef;
    _ok(iVar2,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pcVar32 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_e58 = (code *)0x13851c;
    _ok((uint)(pcVar37 == pcVar25),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    if ((long)pacVar30 < 0) {
LAB_001385cb:
      pcStack_e58 = (code *)0x1385d0;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_001385d0:
      pcStack_e58 = (code *)0x1385ef;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pacVar12 = (char (*) [16])(ulong)(pacVar30 == pacStack_e40);
    pcVar16 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_e58 = (code *)0x13854d;
    _ok((uint)(pacVar30 == pacStack_e40),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar40 = pcVar22;
  }
  lVar5 = lVar5 + 1;
  pcVar42 = pcVar42 + 0x10;
  pcVar22 = pcVar22 + -1;
  pcVar37 = pcVar32;
  puVar28 = (uint *)pcVar40;
  if (pcVar22 == (char *)0x0) {
    return;
  }
  goto LAB_00138274;
LAB_00138782:
  lVar6 = lVar5 * 0x10;
  bVar10 = *(byte *)((long)puVar36 + -2);
  pcVar14 = (code *)(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pcVar14];
  puVar23 = puVar36;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pcVar14 = (code *)(ulong)*(byte *)((long)puVar36 + -1);
      break;
    case 0xcd:
      pcVar14 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar36 + -1) << 8 |
                                       *(ushort *)((long)puVar36 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_107f + lVar6 + -6);
      break;
    case 0xce:
      uVar19 = *(uint *)((long)puVar36 + -1);
      pcVar14 = (code *)(ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                               uVar19 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_107f + lVar6 + -4);
      break;
    case 0xcf:
      uVar39 = *(ulong *)((long)puVar36 + -1);
      pcVar14 = (code *)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                         (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                         (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                         (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
      puVar23 = auStack_107f + lVar5 * 2;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_001389dc:
        pcStack_10c0 = (code *)0x1389e1;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e1:
        pcStack_10c0 = (code *)0x1389e6;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e6:
        pcStack_10c0 = (code *)0x138a05;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar23 = auStack_107f + lVar5 * 2 + -1;
    }
    if (pcVar14 != pcStack_10b8) {
      pcStack_10c0 = (code *)0x138a2e;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_00138a2e:
      pcStack_10c0 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_10c0 = (code *)0x1411a4;
      builtin_strncpy(acStack_11f0,"typed read of ",0xf);
      pcStack_1328 = (code *)0x138a9a;
      uStack_130c = extraout_EDX;
      pcStack_12f8 = (code *)pcVar37;
      puStack_10e8 = puVar23;
      uStack_10e0 = uVar35;
      puStack_10d8 = puVar36;
      lStack_10d0 = lVar5;
      puStack_10c8 = puVar24;
      iVar2 = snprintf(acStack_11f0 + 0xe,0xf2,"%llu",pcVar16);
      pcVar37 = acStack_11f0 + (long)iVar2 + 0xe;
      pcStack_1328 = (code *)0x138abe;
      iVar2 = snprintf(pcVar37,(size_t)(auStack_10f0 + -(long)pcVar37)," into ");
      pcStack_1328 = (code *)0x138ad8;
      snprintf(pcVar37 + iVar2,(size_t)(auStack_10f0 + -(long)(pcVar37 + iVar2)),"double");
      pcStack_1328 = (code *)0x138ae7;
      _space((FILE *)_stdout);
      pcStack_1328 = (code *)0x138b00;
      fwrite("# ",2,1,_stdout);
      pcStack_1328 = (code *)0x138b10;
      fputs(acStack_11f0,_stdout);
      pcStack_1328 = (code *)0x138b1d;
      fputc(10,_stdout);
      pcStack_1328 = (code *)0x138b2a;
      iVar2 = test_encode_uint_all_sizes((char (*) [16])&bStack_12f0,(uint64_t)pcVar16);
      pacVar12 = (char (*) [16])(&bStack_12f0 + (long)iVar2 * 0x10);
      pcStack_1328 = (code *)0x138b48;
      pacStack_1320 = (char (*) [16])pcVar16;
      iVar3 = test_encode_int_all_sizes(pacVar12,(int64_t)pcVar16);
      uVar19 = iVar2 + iVar3;
      if (uVar19 == 0 || SCARRY4(iVar2,iVar3) != (int)uVar19 < 0) {
        return;
      }
      fStack_1310 = (float)(long)pacStack_1320;
      dStack_1308 = (double)(long)pacStack_1320;
      uVar35 = (ulong)uVar19;
      pcVar22 = (char *)((long)&uStack_12ef + 1);
      lVar5 = 0;
      goto LAB_00138b77;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138a0a:
      pcStack_10c0 = (code *)0x138a29;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)((long)puVar36 + -1);
    fVar15 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar15 != fStack_10ac) || (NAN(fVar15) || NAN(fStack_10ac))) goto LAB_001389e1;
    puVar23 = (undefined8 *)((long)puVar36 + 3);
  }
  else if (mVar1 == MP_INT) {
    pcVar14 = (code *)(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pcVar14 = (code *)(long)*(char *)((long)puVar36 + -1);
      pcVar37 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd1:
      pcVar14 = (code *)(long)(short)(*(ushort *)((long)puVar36 + -1) << 8 |
                                     *(ushort *)((long)puVar36 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_107f + lVar6 + -6);
      pcVar37 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd2:
      uVar19 = *(uint *)((long)puVar36 + -1);
      pcVar14 = (code *)(long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 |
                                    (uVar19 & 0xff00) << 8 | uVar19 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_107f + lVar6 + -4);
      pcVar37 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd3:
      uVar39 = *(ulong *)((long)puVar36 + -1);
      pcVar14 = (code *)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                         (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                         (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                         (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
      puVar23 = auStack_107f + lVar5 * 2;
      pcVar37 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_10c0 = (code *)0x1389dc;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001389dc;
      }
      puVar23 = auStack_107f + lVar5 * 2 + -1;
    }
    if (pcVar14 != pcStack_10b8) goto LAB_00138a2e;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_001389e6;
    uVar39 = *(ulong *)((long)puVar36 + -1);
    dVar18 = (double)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                      (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                      (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                      (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
    if ((dVar18 != dStack_10a8) || (NAN(dVar18) || NAN(dStack_10a8))) {
      pcStack_10c0 = (code *)0x138a0a;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_00138a0a;
    }
    puVar23 = auStack_107f + lVar5 * 2;
  }
  puStack_1098 = (undefined8 *)((long)puVar36 + -2);
  puVar24 = (undefined1 *)(ulong)(uint)(int)(char)bVar10;
  dStack_10a0 = 0.0;
  pcStack_10c0 = (code *)0x138922;
  iVar2 = (*(code *)pacStack_1090)(&puStack_1098,&dStack_10a0);
  pcStack_10c0 = (code *)0x13894a;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar24);
  pcStack_10c0 = (code *)0x138972;
  _ok((uint)(puVar23 == puStack_1098),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar44 = ABS(dStack_10a8 - dStack_10a0) < 1e-15;
  pcVar16 = (char *)(ulong)bVar44;
  pcVar37 = "double_eq(num1, num2)";
  pcStack_10c0 = (code *)0x1389b5;
  _ok((uint)bVar44,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar5 = lVar5 + 1;
  puVar36 = puVar36 + 2;
  uVar35 = uVar35 - 1;
  if (uVar35 == 0) {
    return;
  }
  goto LAB_00138782;
LAB_00138b77:
  lVar6 = lVar5 * 0x10;
  bVar10 = pcVar22[-2];
  pacVar8 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar8];
  pcVar32 = pcVar22;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar8 = (char (*) [16])(ulong)(byte)pcVar22[-1];
      break;
    case 0xcd:
      pacVar8 = (char (*) [16])
                (ulong)(ushort)(*(ushort *)(pcVar22 + -1) << 8 | *(ushort *)(pcVar22 + -1) >> 8);
      pcVar32 = acStack_12e7 + lVar6 + -6;
      break;
    case 0xce:
      uVar19 = *(uint *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                       uVar19 << 0x18);
      pcVar32 = acStack_12e7 + lVar6 + -4;
      break;
    case 0xcf:
      uVar39 = *(ulong *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
      pcVar32 = acStack_12e7 + lVar5 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00138e36:
        pcStack_1328 = (code *)0x138e3b;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
        pcStack_1328 = (code *)0x138e40;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
        pcStack_1328 = (code *)0x138e5f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar32 = acStack_12e7 + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_1320) {
      pcStack_1328 = (code *)0x138e88;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
      pcStack_1328 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1558,"typed read of ",0xf);
      pcStack_1590 = (code *)0x138ef1;
      uStack_1574 = extraout_EDX_00;
      pacStack_1560 = (char (*) [16])pcVar16;
      lStack_1350 = lVar5;
      uStack_1348 = uVar35;
      pcStack_1340 = pcVar37;
      pcStack_1338 = pcVar32;
      pcStack_1330 = pcVar22;
      pcStack_1328 = (code *)pcVar42;
      iVar2 = snprintf(acStack_1558 + 0xe,0xf2,"%lld",pacVar12);
      pcVar37 = acStack_1558 + (long)iVar2 + 0xe;
      pcStack_1590 = (code *)0x138f12;
      iVar2 = snprintf(pcVar37,(size_t)(&bStack_1458 + -(long)pcVar37)," into ");
      pcStack_1590 = (code *)0x138f2c;
      snprintf(pcVar37 + iVar2,(size_t)(&bStack_1458 + -(long)(pcVar37 + iVar2)),"double");
      pcStack_1590 = (code *)0x138f3b;
      _space((FILE *)_stdout);
      pcStack_1590 = (code *)0x138f54;
      fwrite("# ",2,1,_stdout);
      pcStack_1590 = (code *)0x138f61;
      fputs(acStack_1558,_stdout);
      pcStack_1590 = (code *)0x138f6e;
      fputc(10,_stdout);
      pacVar8 = (char (*) [16])&bStack_1458;
      pcStack_1590 = (code *)0x138f82;
      pacStack_1588 = pacVar12;
      uVar19 = test_encode_int_all_sizes(pacVar8,(int64_t)pacVar12);
      if ((int)uVar19 < 1) {
        return;
      }
      fStack_1578 = (float)(long)pacStack_1588;
      dStack_1570 = (double)(long)pacStack_1588;
      uVar35 = (ulong)uVar19;
      pcVar16 = (char *)((long)&uStack_1457 + 1);
      lVar5 = 0;
      goto LAB_00138fb4;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138e64:
      pcStack_1328 = (code *)0x138e83;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)(pcVar22 + -1);
    fVar15 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar15 != fStack_1310) || (NAN(fVar15) || NAN(fStack_1310))) goto LAB_00138e3b;
    pcVar32 = pcVar22 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar8 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar8 = (char (*) [16])(long)pcVar22[-1];
      pcVar16 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      break;
    case 0xd1:
      pacVar8 = (char (*) [16])
                (long)(short)(*(ushort *)(pcVar22 + -1) << 8 | *(ushort *)(pcVar22 + -1) >> 8);
      pcVar16 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_12e7 + lVar6 + -6;
      break;
    case 0xd2:
      uVar19 = *(uint *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                           uVar19 << 0x18);
      pcVar16 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_12e7 + lVar6 + -4;
      break;
    case 0xd3:
      uVar39 = *(ulong *)(pcVar22 + -1);
      pacVar8 = (char (*) [16])
                (uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
      pcVar16 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_12e7 + lVar5 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_1328 = (code *)0x138e36;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00138e36;
      }
      pcVar32 = acStack_12e7 + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_1320) goto LAB_00138e88;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00138e40;
    uVar39 = *(ulong *)(pcVar22 + -1);
    dVar18 = (double)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                      (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                      (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                      (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
    if ((dVar18 != dStack_1308) || (NAN(dVar18) || NAN(dStack_1308))) {
      pcStack_1328 = (code *)0x138e64;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00138e64;
    }
    pcVar32 = acStack_12e7 + lVar5 * 0x10;
  }
  pcVar42 = pcVar22 + -2;
  pcVar37 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_1300 = 0.0;
  pcStack_1328 = (code *)0x138d17;
  pcStack_1318 = pcVar42;
  iVar2 = (*pcStack_12f8)(&pcStack_1318,&dStack_1300);
  if ((char)uStack_130c == '\0') {
    pcStack_1328 = (code *)0x138de7;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar37);
    bVar44 = pcVar42 == pcStack_1318;
    pcVar16 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar32 = "check position";
  }
  else {
    pcVar42 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_1328 = (code *)0x138d51;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar37);
    pcStack_1328 = (code *)0x138d79;
    _ok((uint)(pcVar32 == pcStack_1318),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar44 = ABS(dStack_1308 - dStack_1300) < 1e-15;
    pcVar16 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar32 = "check float number";
  }
  pacVar12 = (char (*) [16])(ulong)bVar44;
  pcStack_1328 = (code *)0x138e0f;
  _ok((uint)bVar44,pcVar16,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar32);
  lVar5 = lVar5 + 1;
  pcVar22 = pcVar22 + 0x10;
  uVar35 = uVar35 - 1;
  if (uVar35 == 0) {
    return;
  }
  goto LAB_00138b77;
LAB_00138fb4:
  lVar6 = lVar5 * 0x10;
  bVar10 = pcVar16[-2];
  pacVar12 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar12];
  pcVar22 = pcVar16;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar12 = (char (*) [16])(ulong)(byte)pcVar16[-1];
      break;
    case 0xcd:
      pacVar12 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar16 + -1) << 8 | *(ushort *)(pcVar16 + -1) >> 8);
      pcVar22 = acStack_144f + lVar6 + -6;
      break;
    case 0xce:
      uVar19 = *(uint *)(pcVar16 + -1);
      pacVar12 = (char (*) [16])
                 (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                        uVar19 << 0x18);
      pcVar22 = acStack_144f + lVar6 + -4;
      break;
    case 0xcf:
      uVar39 = *(ulong *)(pcVar16 + -1);
      pacVar12 = (char (*) [16])
                 (uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                  (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                  (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                  (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
      pcVar22 = acStack_144f + lVar5 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00139276:
        pcStack_1590 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_1590 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_1590 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar22 = acStack_144f + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar12 != pacStack_1588) {
      pcStack_1590 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_1590 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_17c0,"typed read of ",0xf);
      uVar33 = CONCAT71((int7)(uVar35 >> 8),1);
      pcStack_17d8 = (code *)0x13932e;
      lStack_15b8 = lVar5;
      uStack_15b0 = uVar35;
      pcStack_15a8 = pcVar37;
      pcStack_15a0 = pcVar22;
      pcStack_1598 = pcVar16;
      pcStack_1590 = (code *)pcVar42;
      iVar2 = snprintf(acStack_17c0 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar37 = acStack_17c0 + (long)iVar2 + 0xe;
      pcStack_17d8 = (code *)0x13934f;
      iVar2 = snprintf(pcVar37,(size_t)(abStack_16c0 + -(long)pcVar37)," into ");
      pcStack_17d8 = (code *)0x139369;
      snprintf(pcVar37 + iVar2,(size_t)(abStack_16c0 + -(long)(pcVar37 + iVar2)),"double");
      puVar41 = &stdout;
      pcStack_17d8 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_17d8 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_17d8 = (code *)0x13939e;
      fputs(acStack_17c0,_stdout);
      pcVar14 = (code *)0xa;
      pcStack_17d8 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_16c0[0] = 0xca;
      abStack_16c0[1] = 0x4a;
      abStack_16c0[2] = 200;
      abStack_16c0[3] = 0x59;
      abStack_16c0[4] = 0x10;
      abStack_16b0[0] = 0xcb;
      abStack_16b0[1] = 0x41;
      abStack_16b0[2] = 0x59;
      abStack_16b0[3] = 0xb;
      abStack_16b0[4] = 0x22;
      abStack_16b0[5] = 0;
      abStack_16b0[6] = 0;
      abStack_16b0[7] = 0;
      abStack_16b0[8] = 0;
      pbVar9 = abStack_16c0;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001392a4:
      pcStack_1590 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)(pcVar16 + -1);
    fVar15 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar15 != fStack_1578) || (NAN(fVar15) || NAN(fStack_1578))) goto LAB_0013927b;
    pcVar22 = pcVar16 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar12 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar12 = (char (*) [16])(long)pcVar16[-1];
      break;
    case 0xd1:
      pacVar12 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar16 + -1) << 8 | *(ushort *)(pcVar16 + -1) >> 8);
      pcVar22 = acStack_144f + lVar6 + -6;
      break;
    case 0xd2:
      uVar19 = *(uint *)(pcVar16 + -1);
      pacVar12 = (char (*) [16])
                 (long)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                            uVar19 << 0x18);
      pcVar22 = acStack_144f + lVar6 + -4;
      break;
    case 0xd3:
      uVar39 = *(ulong *)(pcVar16 + -1);
      pacVar12 = (char (*) [16])
                 (uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                  (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                  (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                  (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
      pcVar22 = acStack_144f + lVar5 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_1590 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar22 = acStack_144f + (lVar5 * 2 + -1) * 8;
    }
    if (pacVar12 != pacStack_1588) goto LAB_001392c8;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00139280;
    uVar39 = *(ulong *)(pcVar16 + -1);
    dVar18 = (double)(uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                      (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                      (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                      (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38);
    if ((dVar18 != dStack_1570) || (NAN(dVar18) || NAN(dStack_1570))) {
      pcStack_1590 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar22 = acStack_144f + lVar5 * 0x10;
  }
  pcVar42 = pcVar16 + -2;
  pcVar37 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_1568 = 0.0;
  pcStack_1590 = (code *)0x139157;
  pcStack_1580 = pcVar42;
  iVar2 = (*(code *)pacStack_1560)(&pcStack_1580,&dStack_1568);
  if ((char)uStack_1574 == '\0') {
    pcStack_1590 = (code *)0x139227;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar37);
    bVar44 = pcVar42 == pcStack_1580;
    pcVar22 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar32 = "check position";
  }
  else {
    pcVar42 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_1590 = (code *)0x139191;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar37);
    pcStack_1590 = (code *)0x1391b9;
    _ok((uint)(pcVar22 == pcStack_1580),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar44 = ABS(dStack_1570 - dStack_1568) < 1e-15;
    pcVar22 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar32 = "check float number";
  }
  pacVar8 = (char (*) [16])(ulong)bVar44;
  pcStack_1590 = (code *)0x13924f;
  _ok((uint)bVar44,pcVar22,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar32);
  lVar5 = lVar5 + 1;
  pcVar16 = pcVar16 + 0x10;
  uVar35 = uVar35 - 1;
  if (uVar35 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar10 = *pbVar9;
  uVar35 = (ulong)bVar10;
  mVar1 = mp_type_hint[uVar35];
  if (mVar1 == MP_UINT) {
    if (bVar10 == 0xce) {
      uVar19 = *(uint *)(pbVar9 + 1);
      uVar39 = (ulong)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                      uVar19 << 0x18);
      pbVar38 = pbVar9 + 5;
LAB_001394a6:
      if (uVar39 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar10 == 0xcf) {
        uVar39 = *(ulong *)(pbVar9 + 1);
        uVar39 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
                 (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
                 (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 |
                 (uVar39 & 0xff00) << 0x28 | uVar39 << 0x38;
        pbVar38 = pbVar9 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar10 - 0xcc) && ((char)bVar10 < '\0')) {
        pcStack_17d8 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_17d8 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar10 = (byte)uVar35;
    uVar19 = extraout_EDX_01;
LAB_001395b5:
    if ((1 < uVar19 - 0xd0) && (bVar10 < 0xe0)) {
LAB_00139617:
      pcStack_17d8 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_19f8,"typed read of ",0xf);
      pacStack_17f0 = pacVar8;
      uStack_17e8 = uVar33;
      puStack_17e0 = puVar41;
      pcStack_17d8 = (code *)abStack_16b0;
      iVar2 = snprintf(acStack_19f8 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar37 = acStack_19f8 + (long)iVar2 + 0xe;
      iVar2 = snprintf(pcVar37,(size_t)(&uStack_18f8 + -(long)pcVar37)," into ");
      snprintf(pcVar37 + iVar2,(size_t)(&uStack_18f8 + -(long)(pcVar37 + iVar2)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_19f8,_stdout);
      fputc(10,_stdout);
      puStack_1a00 = &uStack_18f8;
      uStack_18f8 = 0xcb;
      uStack_18f7 = 0xb81e85eb513816c0;
      dStack_1a08 = 0.0;
      iVar2 = (*pcVar14)(&puStack_1a00,&dStack_1a08);
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_18ef == puStack_1a00),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_1a08) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_17d8 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_17d8 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_17d8 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001395f3:
      pcStack_17d8 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar19 = *(uint *)(pbVar9 + 1);
    fVar15 = (float)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                    uVar19 << 0x18);
    if ((fVar15 == 6.565e+06) && (!NAN(fVar15))) {
      pbVar38 = pbVar9 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar10 != 0xd2) {
      uVar19 = (uint)bVar10;
      if (bVar10 == 0xd3) {
        uVar35 = *(ulong *)(pbVar9 + 1);
        uVar35 = uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                 (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                 (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                 (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38;
        pbVar38 = pbVar9 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar19 = *(uint *)(pbVar9 + 1);
    pbVar38 = pbVar9 + 5;
    uVar35 = (ulong)(int)(uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18);
LAB_001394c0:
    if (uVar35 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar10 != 0xcb) goto LAB_001395cf;
  uVar35 = *(ulong *)(pbVar9 + 1);
  dVar18 = (double)(uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                    (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                    (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                    (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38);
  if ((dVar18 != 6565000.0) || (NAN(dVar18))) {
    pcStack_17d8 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar38 = pbVar9 + 9;
LAB_001394cd:
  puVar41 = (undefined *)(ulong)(uint)(int)(char)bVar10;
  dStack_17d0 = 0.0;
  pcStack_17d8 = (code *)0x1394e8;
  pbStack_17c8 = pbVar9;
  iVar2 = (*(code *)pacVar8)(&pbStack_17c8,&dStack_17d0);
  pcStack_17d8 = (code *)0x139510;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar41);
  pcStack_17d8 = (code *)0x139538;
  _ok((uint)(pbVar38 == pbStack_17c8),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar44 = ABS(6565000.0 - dStack_17d0) < 1e-15;
  pcVar14 = (code *)(ulong)bVar44;
  pcStack_17d8 = (code *)0x13957c;
  _ok((uint)bVar44,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar31 = (char)uVar33;
  uVar33 = 0;
  pbVar9 = abStack_16b0;
  if (cVar31 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}